

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O1

string * ensure_one_newline(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  string str;
  undefined1 local_41;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long local_38;
  char local_30 [16];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_40._M_current = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_41 = 10;
  _Var2 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_40,local_40._M_current + local_38,(_Iter_equals_val<const_char>)&local_41
                    );
  local_38 = (long)_Var2._M_current - (long)local_40._M_current;
  *_Var2._M_current = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_40._M_current,local_40._M_current + local_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_40._M_current != local_30) {
    operator_delete(local_40._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

string ensure_one_newline(const string &s) {
    string str(s);
    str.erase(std::remove(str.begin(), str.end(), '\n'), str.end());
    return str + "\n";
}